

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O1

void Am_Enum_Print_Helper(ostream *out,Am_ID_Tag type,long value)

{
  Am_Type_Support *pAVar1;
  Am_Value v;
  Am_ID_Tag local_28;
  Am_Value_Type in_stack_ffffffffffffffdc;
  
  pAVar1 = Am_Find_Support(in_stack_ffffffffffffffdc);
  if (pAVar1 != (Am_Type_Support *)0x0) {
    local_28 = type;
    (**pAVar1->_vptr_Am_Type_Support)(pAVar1,out);
    Am_Value::~Am_Value((Am_Value *)&local_28);
    return;
  }
  Am_Standard_Print(out,value,type);
  return;
}

Assistant:

void
Am_Enum_Print_Helper(std::ostream &out, Am_ID_Tag type, long value)
{
  Am_Type_Support *support = Am_Find_Support(type);
  if (support) {
    Am_Value v(value, type);
    support->Print(out, v);
  } else
    Am_Standard_Print(out, (unsigned long)value, type);
}